

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.cc
# Opt level: O2

void __thiscall
brotli::BlockSplitter<brotli::Histogram<704>_>::FinishBlock
          (BlockSplitter<brotli::Histogram<704>_> *this,bool is_final)

{
  uint uVar1;
  vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *pvVar2;
  long lVar3;
  BlockSplit *pBVar4;
  size_t sVar5;
  pointer puVar6;
  pointer puVar7;
  size_t sVar8;
  pointer pHVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  Histogram<704> *this_00;
  double dVar13;
  double dVar14;
  double diff [2];
  double combined_entropy [2];
  Histogram<704> combined_histo [2];
  double local_1678 [4];
  Histogram<704> local_1658;
  undefined1 local_b48 [2824];
  undefined8 local_40;
  
  uVar11 = this->min_block_size_;
  uVar10 = this->block_size_;
  if (this->block_size_ < uVar11) {
    this->block_size_ = uVar11;
    uVar10 = uVar11;
  }
  if (this->num_blocks_ == 0) {
    pBVar4 = this->split_;
    *(pBVar4->lengths).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_start = (uint)uVar10;
    *(pBVar4->types).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_start = '\0';
    dVar13 = BitsEntropy(((this->histograms_->
                          super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)->data_,this->alphabet_size_);
    this->last_entropy_[0] = dVar13;
    this->last_entropy_[1] = dVar13;
    this->num_blocks_ = this->num_blocks_ + 1;
    this->split_->num_types = this->split_->num_types + 1;
    this->curr_histogram_ix_ = this->curr_histogram_ix_ + 1;
    this->block_size_ = 0;
  }
  else if (uVar10 != 0) {
    dVar13 = BitsEntropy((this->histograms_->
                         super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[this->curr_histogram_ix_].data_,
                         this->alphabet_size_);
    this_00 = &local_1658;
    memset(this_00,0,0xb08);
    local_1658.bit_cost_ = INFINITY;
    memset(local_b48,0,0xb08);
    local_40 = 0x7ff0000000000000;
    for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 8) {
      pvVar2 = this->histograms_;
      lVar3 = *(long *)((long)this->last_histogram_ix_ + lVar12);
      memcpy(this_00,(pvVar2->
                     super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + this->curr_histogram_ix_,0xb10);
      Histogram<704>::AddHistogram
                (this_00,(pvVar2->
                         super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + lVar3);
      dVar14 = BitsEntropy(this_00->data_,this->alphabet_size_);
      *(double *)((long)local_1678 + lVar12 + 0x10) = dVar14;
      *(double *)((long)local_1678 + lVar12) =
           (dVar14 - dVar13) - *(double *)((long)this->last_entropy_ + lVar12);
      this_00 = this_00 + 1;
    }
    pBVar4 = this->split_;
    uVar11 = pBVar4->num_types;
    if (((0xff < uVar11) || (local_1678[0] <= this->split_threshold_)) ||
       (local_1678[1] <= this->split_threshold_)) {
      uVar1 = (uint)this->block_size_;
      sVar5 = this->num_blocks_;
      puVar6 = (pBVar4->lengths).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (local_1678[0] + -20.0 <= local_1678[1]) {
        puVar6 = puVar6 + (sVar5 - 1);
        *puVar6 = *puVar6 + uVar1;
        memcpy((this->histograms_->
               super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>)
               ._M_impl.super__Vector_impl_data._M_start + this->last_histogram_ix_[0],&local_1658,
               0xb10);
        this->last_entropy_[0] = local_1678[2];
        if (this->split_->num_types == 1) {
          this->last_entropy_[1] = local_1678[2];
        }
        this->block_size_ = 0;
        pHVar9 = (this->histograms_->
                 super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        sVar5 = this->curr_histogram_ix_;
        memset(pHVar9 + sVar5,0,0xb08);
        pHVar9[sVar5].bit_cost_ = INFINITY;
        uVar11 = this->merge_last_count_ + 1;
        this->merge_last_count_ = uVar11;
        if (1 < uVar11) {
          this->target_block_size_ = this->target_block_size_ + this->min_block_size_;
        }
        goto LAB_0017f2eb;
      }
      puVar6[sVar5] = uVar1;
      puVar7 = (pBVar4->types).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar7[sVar5] = puVar7[sVar5 - 2];
      pvVar2 = this->histograms_;
      sVar5 = this->last_histogram_ix_[0];
      sVar8 = this->last_histogram_ix_[1];
      this->last_histogram_ix_[0] = sVar8;
      this->last_histogram_ix_[1] = sVar5;
      memcpy((pvVar2->
             super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>).
             _M_impl.super__Vector_impl_data._M_start + sVar8,local_b48,0xb10);
      this->last_entropy_[1] = this->last_entropy_[0];
      this->last_entropy_[0] = local_1678[3];
      this->num_blocks_ = this->num_blocks_ + 1;
      this->block_size_ = 0;
      pHVar9 = (this->histograms_->
               super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      sVar5 = this->curr_histogram_ix_;
      memset(pHVar9 + sVar5,0,0xb08);
      pHVar9[sVar5].bit_cost_ = INFINITY;
    }
    else {
      sVar5 = this->num_blocks_;
      (pBVar4->lengths).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[sVar5] = (uint)this->block_size_;
      (pBVar4->types).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[sVar5] = (uchar)uVar11;
      pBVar4 = this->split_;
      this->last_histogram_ix_[1] = this->last_histogram_ix_[0];
      this->last_histogram_ix_[0] = (ulong)(byte)pBVar4->num_types;
      this->last_entropy_[1] = this->last_entropy_[0];
      this->last_entropy_[0] = dVar13;
      this->num_blocks_ = this->num_blocks_ + 1;
      pBVar4->num_types = pBVar4->num_types + 1;
      this->curr_histogram_ix_ = this->curr_histogram_ix_ + 1;
      this->block_size_ = 0;
    }
    this->merge_last_count_ = 0;
    this->target_block_size_ = this->min_block_size_;
  }
LAB_0017f2eb:
  if (is_final) {
    std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::resize
              (this->histograms_,this->split_->num_types);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->split_->types,this->num_blocks_);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->split_->lengths,this->num_blocks_);
  }
  return;
}

Assistant:

void FinishBlock(bool is_final) {
    if (block_size_ < min_block_size_) {
      block_size_ = min_block_size_;
    }
    if (num_blocks_ == 0) {
      // Create first block.
      split_->lengths[0] = static_cast<uint32_t>(block_size_);
      split_->types[0] = 0;
      last_entropy_[0] =
          BitsEntropy(&(*histograms_)[0].data_[0], alphabet_size_);
      last_entropy_[1] = last_entropy_[0];
      ++num_blocks_;
      ++split_->num_types;
      ++curr_histogram_ix_;
      block_size_ = 0;
    } else if (block_size_ > 0) {
      double entropy = BitsEntropy(&(*histograms_)[curr_histogram_ix_].data_[0],
                                   alphabet_size_);
      HistogramType combined_histo[2];
      double combined_entropy[2];
      double diff[2];
      for (size_t j = 0; j < 2; ++j) {
        size_t last_histogram_ix = last_histogram_ix_[j];
        combined_histo[j] = (*histograms_)[curr_histogram_ix_];
        combined_histo[j].AddHistogram((*histograms_)[last_histogram_ix]);
        combined_entropy[j] = BitsEntropy(
            &combined_histo[j].data_[0], alphabet_size_);
        diff[j] = combined_entropy[j] - entropy - last_entropy_[j];
      }

      if (split_->num_types < kMaxBlockTypes &&
          diff[0] > split_threshold_ &&
          diff[1] > split_threshold_) {
        // Create new block.
        split_->lengths[num_blocks_] = static_cast<uint32_t>(block_size_);
        split_->types[num_blocks_] = static_cast<uint8_t>(split_->num_types);
        last_histogram_ix_[1] = last_histogram_ix_[0];
        last_histogram_ix_[0] = static_cast<uint8_t>(split_->num_types);
        last_entropy_[1] = last_entropy_[0];
        last_entropy_[0] = entropy;
        ++num_blocks_;
        ++split_->num_types;
        ++curr_histogram_ix_;
        block_size_ = 0;
        merge_last_count_ = 0;
        target_block_size_ = min_block_size_;
      } else if (diff[1] < diff[0] - 20.0) {
        // Combine this block with second last block.
        split_->lengths[num_blocks_] = static_cast<uint32_t>(block_size_);
        split_->types[num_blocks_] = split_->types[num_blocks_ - 2];
        std::swap(last_histogram_ix_[0], last_histogram_ix_[1]);
        (*histograms_)[last_histogram_ix_[0]] = combined_histo[1];
        last_entropy_[1] = last_entropy_[0];
        last_entropy_[0] = combined_entropy[1];
        ++num_blocks_;
        block_size_ = 0;
        (*histograms_)[curr_histogram_ix_].Clear();
        merge_last_count_ = 0;
        target_block_size_ = min_block_size_;
      } else {
        // Combine this block with last block.
        split_->lengths[num_blocks_ - 1] += static_cast<uint32_t>(block_size_);
        (*histograms_)[last_histogram_ix_[0]] = combined_histo[0];
        last_entropy_[0] = combined_entropy[0];
        if (split_->num_types == 1) {
          last_entropy_[1] = last_entropy_[0];
        }
        block_size_ = 0;
        (*histograms_)[curr_histogram_ix_].Clear();
        if (++merge_last_count_ > 1) {
          target_block_size_ += min_block_size_;
        }
      }
    }
    if (is_final) {
      (*histograms_).resize(split_->num_types);
      split_->types.resize(num_blocks_);
      split_->lengths.resize(num_blocks_);
    }
  }